

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

BOOL GetFileInformationByHandle(HANDLE hFile,LPBY_HANDLE_FILE_INFORMATION lpFileInformation)

{
  DWORD DVar1;
  int iVar2;
  BOOL BVar3;
  uint uVar4;
  CPalThread *pCVar5;
  FILETIME FVar6;
  ulong uVar7;
  DWORD *pDVar8;
  uint uVar9;
  undefined1 local_e0 [8];
  stat stat_data;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  
  pLocalDataLock = (IDataLock *)0x0;
  stat_data.__glibc_reserved[2] = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002c18c1;
  pCVar5 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pCVar5 == (CPalThread *)0x0) {
    pCVar5 = CreateCurrentThreadData();
  }
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c18c1;
    BVar3 = 0;
    DVar1 = 6;
  }
  else {
    DVar1 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                      (CorUnix::g_pObjectManager,pCVar5,hFile,CorUnix::aotFile,0x80000000,
                       &pLocalDataLock);
    if (DVar1 == 0) {
      BVar3 = 0;
      DVar1 = (*pLocalDataLock->_vptr_IDataLock[3])
                        (pLocalDataLock,pCVar5,0,&pLocalData,stat_data.__glibc_reserved + 2);
      if (DVar1 == 0) {
        iVar2 = fstat64(*(int *)(stat_data.__glibc_reserved[2] + 8),(stat64 *)local_e0);
        if (iVar2 == 0) {
          if (((uint)stat_data.st_nlink & 0xf000) == 0x4000) {
            pFileObject._4_4_ = 0x10;
          }
          else {
            if (((uint)stat_data.st_nlink & 0xf000) != 0x8000) {
              DVar1 = 5;
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c18c1;
              goto LAB_002c1873;
            }
            pFileObject._4_4_ = 0;
          }
          BVar3 = UTIL_IsReadOnlyBitsSet((stat *)local_e0);
          uVar9 = BVar3 != 0 | pFileObject._4_4_;
          uVar4 = 0x80;
          if (uVar9 != 0) {
            uVar4 = uVar9;
          }
          lpFileInformation->dwFileAttributes = uVar4;
          FVar6 = FILEUnixTimeToFileTime(stat_data.st_mtim.tv_nsec,0);
          lpFileInformation->ftCreationTime = FVar6;
          FVar6 = FILEUnixTimeToFileTime(stat_data.st_blocks,0);
          lpFileInformation->ftLastAccessTime = FVar6;
          FVar6 = FILEUnixTimeToFileTime(stat_data.st_atim.tv_nsec,0);
          lpFileInformation->ftLastWriteTime = FVar6;
          lpFileInformation->dwVolumeSerialNumber = local_e0._0_4_;
          uVar7 = stat_data.st_rdev >> 0x20 | stat_data.st_rdev << 0x20;
          lpFileInformation->nFileSizeHigh = (int)uVar7;
          lpFileInformation->nFileSizeLow = (int)(uVar7 >> 0x20);
          lpFileInformation->nNumberOfLinks = (DWORD)stat_data.st_ino;
          lpFileInformation->nFileIndexHigh = 0;
          lpFileInformation->nFileIndexLow = (DWORD)stat_data.st_dev;
          BVar3 = 1;
        }
        else {
          DVar1 = FILEGetLastErrorFromErrno();
        }
      }
    }
    else {
      BVar3 = 0;
    }
  }
LAB_002c1873:
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pCVar5,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pCVar5);
  }
  if (DVar1 != 0) {
    pDVar8 = (DWORD *)__errno_location();
    *pDVar8 = DVar1;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar3;
  }
LAB_002c18c1:
  abort();
}

Assistant:

BOOL
PALAPI
GetFileInformationByHandle(
             IN HANDLE hFile,
             OUT LPBY_HANDLE_FILE_INFORMATION lpFileInformation)
{
    CPalThread *pThread;
    BOOL bRet = FALSE;
    DWORD dwLastError = 0;

    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    DWORD dwAttr = 0;
    struct stat stat_data;

    PERF_ENTRY(GetFileInformationByHandle);
    ENTRY("GetFileInformationByHandle(hFile=%p, lpFileInformation=%p)\n",
          hFile, lpFileInformation);

    pThread = InternalGetCurrentThread();

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        dwLastError = ERROR_INVALID_HANDLE;
        goto done;
    }

    dwLastError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != dwLastError)
    {
        goto done;
    }
    
    dwLastError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != dwLastError)
    {
        goto done;
    }

    if ( fstat(pLocalData->unix_fd, &stat_data) != 0 )
    {
        if ((dwLastError = FILEGetLastErrorFromErrno()) == ERROR_INTERNAL_ERROR)
        {
            ASSERT("fstat() not expected to fail with errno:%d (%s)\n",
                   errno, strerror(errno));
        }
        goto done;
    }

    if ( (stat_data.st_mode & S_IFMT) == S_IFDIR )
    {
        dwAttr |= FILE_ATTRIBUTE_DIRECTORY;
    }
    else if ( (stat_data.st_mode & S_IFMT) != S_IFREG )
    {
        ERROR("Not a regular file or directory, S_IFMT is %#x\n", 
              stat_data.st_mode & S_IFMT);
        dwLastError = ERROR_ACCESS_DENIED;
        goto done;
    }

    if ( UTIL_IsReadOnlyBitsSet( &stat_data ) )
    {
        dwAttr |= FILE_ATTRIBUTE_READONLY;
    }

    /* finally, if nothing is set... */
    if ( dwAttr == 0 )
    {
        dwAttr = FILE_ATTRIBUTE_NORMAL;
    }

    lpFileInformation->dwFileAttributes = dwAttr;

    /* get the file times */
    lpFileInformation->ftCreationTime =
        FILEUnixTimeToFileTime( stat_data.st_ctime,
                                ST_CTIME_NSEC(&stat_data) );
    lpFileInformation->ftLastAccessTime =
        FILEUnixTimeToFileTime( stat_data.st_atime,
                                ST_ATIME_NSEC(&stat_data) );
    lpFileInformation->ftLastWriteTime =
        FILEUnixTimeToFileTime( stat_data.st_mtime,
                                ST_MTIME_NSEC(&stat_data) );

    lpFileInformation->dwVolumeSerialNumber = stat_data.st_dev;

    /* Get the file size. GetFileSize is not used because it gets the
       size of an already-open file */
    lpFileInformation->nFileSizeLow = (DWORD) stat_data.st_size;
#if SIZEOF_OFF_T > 4
    lpFileInformation->nFileSizeHigh = (DWORD)(stat_data.st_size >> 32);
#else
    lpFileInformation->nFileSizeHigh = 0;
#endif

    lpFileInformation->nNumberOfLinks = stat_data.st_nlink;
    lpFileInformation->nFileIndexHigh = 0;
    lpFileInformation->nFileIndexLow = stat_data.st_ino;

    bRet = TRUE;

done:
    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("GetFileInformationByHandle returns BOOL %d\n", bRet);
    PERF_EXIT(GetFileInformationByHandle);
    return bRet;
}